

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# engine_test.cpp
# Opt level: O2

void __thiscall
Engine_testAddDoubleNoTags_Test::Engine_testAddDoubleNoTags_Test
          (Engine_testAddDoubleNoTags_Test *this)

{
  testing::Test::Test(&this->super_Test);
  (this->super_Test)._vptr_Test = (_func_int **)&PTR__Test_0019d598;
  return;
}

Assistant:

TEST(Engine, testAddDoubleNoTags) {
    Engine e("test", std::make_unique<TestHandler>());
    e.Add("foo", 10.5);
    const auto &h = e.GetHandlers()[0];
    auto *th = dynamic_cast<TestHandler *>(h.get());
    ASSERT_EQ(1, th->doubleMeasures.size());
    auto im = th->doubleMeasures[0];
    ASSERT_EQ("test.foo", im.name);
    ASSERT_EQ(MetricType::Counter, im.type);
    ASSERT_EQ(1, im.rate);
    ASSERT_EQ(10.5, im.value);
    ASSERT_EQ(0, im.tags.size());
}